

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

void psa_des_set_key_parity(uint8_t *data,size_t data_size)

{
  if (7 < data_size) {
    mbedtls_des_key_set_parity(data);
  }
  if (0xf < data_size) {
    mbedtls_des_key_set_parity(data + 8);
  }
  if (0x17 < data_size) {
    mbedtls_des_key_set_parity(data + 0x10);
    return;
  }
  return;
}

Assistant:

static void psa_des_set_key_parity( uint8_t *data, size_t data_size )
{
    if( data_size >= 8 )
        mbedtls_des_key_set_parity( data );
    if( data_size >= 16 )
        mbedtls_des_key_set_parity( data + 8 );
    if( data_size >= 24 )
        mbedtls_des_key_set_parity( data + 16 );
}